

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.h
# Opt level: O1

uint GetAutoSenseRadix(StringRef *Str)

{
  ulong uVar1;
  uint uVar2;
  size_t sVar3;
  char *pcVar4;
  ulong uVar5;
  
  uVar1 = Str->Length;
  if (uVar1 == 0) {
    return 10;
  }
  if (uVar1 == 1) {
LAB_00185bdf:
    if (uVar1 == 1) {
      return 10;
    }
    pcVar4 = Str->Data;
    if (*pcVar4 != '0') {
      return 10;
    }
    if (9 < (byte)(pcVar4[1] - 0x30U)) {
      return 10;
    }
    pcVar4 = pcVar4 + 1;
    sVar3 = uVar1 - 1;
  }
  else {
    if (*(short *)Str->Data == 0x7830) {
LAB_00185c45:
      uVar5 = 2;
      if (uVar1 < 2) {
        uVar5 = uVar1;
      }
      sVar3 = uVar1 - uVar5;
      pcVar4 = Str->Data + uVar5;
      uVar2 = 0x10;
      goto LAB_00185c5d;
    }
    if (uVar1 == 1) goto LAB_00185bdf;
    if (*(short *)Str->Data == 0x5830) goto LAB_00185c45;
    if ((*(short *)Str->Data == 0x6230) || (*(short *)Str->Data == 0x4230)) {
      uVar5 = 2;
      if (uVar1 < 2) {
        uVar5 = uVar1;
      }
      sVar3 = uVar1 - uVar5;
      pcVar4 = Str->Data + uVar5;
      uVar2 = 2;
      goto LAB_00185c5d;
    }
    if (*(short *)Str->Data != 0x6f30) goto LAB_00185bdf;
    uVar5 = 2;
    if (uVar1 < 2) {
      uVar5 = uVar1;
    }
    sVar3 = uVar1 - uVar5;
    pcVar4 = Str->Data + uVar5;
  }
  uVar2 = 8;
LAB_00185c5d:
  Str->Data = pcVar4;
  Str->Length = sVar3;
  return uVar2;
}

Assistant:

bool empty() const { return Length == 0; }